

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall
despot::TagManhattanUpperBound::TagManhattanUpperBound(TagManhattanUpperBound *this,BaseTag *model)

{
  double dVar1;
  double dVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int s;
  long lVar6;
  double dVar7;
  double dVar8;
  Floor floor;
  Floor local_70;
  
  despot::ParticleUpperBound::ParticleUpperBound(&this->super_ParticleUpperBound);
  despot::BeliefUpperBound::BeliefUpperBound(&this->super_BeliefUpperBound);
  *(undefined ***)this = &PTR__TagManhattanUpperBound_001217e8;
  *(undefined ***)&this->super_BeliefUpperBound = &PTR__TagManhattanUpperBound_00121828;
  this->tag_model_ = model;
  (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  Floor::Floor(&local_70,&model->floor_);
  iVar3 = (**(code **)(*(long *)this->tag_model_ + 0x10))();
  std::vector<double,_std::allocator<double>_>::resize(&this->value_,(long)iVar3);
  lVar6 = 0;
  while( true ) {
    iVar3 = (**(code **)(*(long *)this->tag_model_ + 0x10))();
    if (iVar3 <= lVar6) break;
    uVar4 = despot::Floor::GetCell((int)&local_70);
    uVar5 = despot::Floor::GetCell((int)&local_70);
    iVar3 = despot::Coord::ManhattanDistance(uVar4,uVar5);
    dVar7 = pow(_position,(double)iVar3);
    dVar2 = _position;
    dVar1 = BaseTag::TAG_REWARD;
    dVar8 = pow(_position,(double)iVar3);
    (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar6] = dVar8 * dVar1 - (1.0 - dVar7) / (1.0 - dVar2);
    lVar6 = lVar6 + 1;
  }
  Floor::~Floor(&local_70);
  return;
}

Assistant:

TagManhattanUpperBound(const BaseTag* model) :
		tag_model_(model) {
		Floor floor = tag_model_->floor_;
		value_.resize(tag_model_->NumStates());
		for (int s = 0; s < tag_model_->NumStates(); s++) {
			Coord rob = floor.GetCell(tag_model_->rob_[s]), opp = floor.GetCell(
				tag_model_->opp_[s]);
			int dist = Coord::ManhattanDistance(rob, opp);
			value_[s] = -(1 - Globals::Discount(dist)) / (1 - Globals::Discount())
				+ tag_model_->TAG_REWARD * Globals::Discount(dist);
		}
	}